

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool bVar2;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar4;
  __m128 _outp;
  __m128 _p1;
  __m128 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_add op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  Allocator *in_stack_fffffffffffffb70;
  Mat *in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  undefined8 uStack_410;
  float local_408 [2];
  float afStack_400 [2];
  float local_3f8 [2];
  float afStack_3f0 [3];
  int local_3e4;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  long local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined8 local_3a0;
  float *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined4 local_378;
  long local_370;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined8 local_350;
  float *local_348;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined4 local_318;
  long local_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined8 local_2f0;
  float *local_2e8;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  binary_op_add local_2c1 [9];
  long *local_2b8;
  long *local_2b0;
  long *local_2a8;
  int local_29c;
  long *local_298;
  undefined1 local_28d;
  int local_28c;
  undefined8 *local_280;
  undefined1 local_275;
  int local_274;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_240;
  undefined8 *local_230;
  undefined8 *local_220;
  undefined1 local_20d;
  int local_20c;
  undefined8 *local_200;
  undefined8 *local_1f0;
  float *local_1e8;
  float *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float *local_1c0;
  long *local_1b8;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  float *local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  long local_178;
  undefined4 local_16c;
  long local_168;
  float *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  long local_140;
  undefined4 local_134;
  long local_130;
  float *local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined8 *local_b0;
  undefined8 *local_90;
  undefined8 *local_70;
  
  local_2c8 = *(int *)((long)in_RDI + 0x2c);
  local_2cc = (int)in_RDI[6];
  local_2d0 = *(int *)((long)in_RDI + 0x34);
  local_2d4 = (int)in_RDI[7];
  local_2d8 = (int)in_RDI[3];
  local_2dc = local_2c8 * local_2cc * local_2d0 * local_2d8;
  local_2b8 = in_RDX;
  local_2b0 = in_RSI;
  local_2a8 = in_RDI;
  Mat::create_like(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_298 = local_2b8;
  bVar2 = true;
  if (*local_2b8 != 0) {
    local_1b8 = local_2b8;
    bVar2 = local_2b8[8] * (long)(int)local_2b8[7] == 0;
  }
  if (bVar2) {
    local_29c = -100;
  }
  else {
    for (local_2e0 = 0; local_2e0 < local_2d4; local_2e0 = local_2e0 + 1) {
      local_268 = &local_330;
      local_14c = *(int *)((long)local_2a8 + 0x2c);
      local_150 = (int)local_2a8[6];
      local_154 = *(undefined4 *)((long)local_2a8 + 0x34);
      local_2e8 = (float *)(*local_2a8 + local_2a8[8] * (long)local_2e0 * local_2a8[2]);
      local_168 = local_2a8[2];
      local_16c = (undefined4)local_2a8[3];
      local_178 = local_2a8[4];
      local_148 = &local_330;
      local_f0 = (long)local_14c * (long)local_150 * local_168;
      local_258 = &local_330;
      local_240 = &local_330;
      local_280 = &local_390;
      local_114 = *(int *)((long)local_2b0 + 0x2c);
      local_118 = (int)local_2b0[6];
      local_11c = *(undefined4 *)((long)local_2b0 + 0x34);
      local_348 = (float *)(*local_2b0 + local_2b0[8] * (long)local_2e0 * local_2b0[2]);
      local_130 = local_2b0[2];
      local_134 = (undefined4)local_2b0[3];
      local_140 = local_2b0[4];
      local_110 = &local_390;
      local_100 = (long)local_114 * (long)local_118 * local_130;
      local_260 = &local_390;
      local_230 = &local_390;
      local_200 = &local_3e0;
      local_184 = *(int *)((long)local_2b8 + 0x2c);
      local_188 = (int)local_2b8[6];
      local_18c = *(undefined4 *)((long)local_2b8 + 0x34);
      local_398 = (float *)(*local_2b8 + local_2b8[8] * (long)local_2e0 * local_2b8[2]);
      local_1a0 = local_2b8[2];
      local_1a4 = (undefined4)local_2b8[3];
      local_1b0 = local_2b8[4];
      local_180 = &local_3e0;
      local_e0 = (long)local_184 * (long)local_188 * local_1a0;
      local_1f0 = &local_3e0;
      local_220 = &local_3e0;
      local_2f8 = 0;
      local_2fc = 0;
      local_300 = 0;
      local_304 = 0;
      local_318 = 0;
      local_320 = 0;
      local_328 = 0;
      local_330 = 0;
      local_358 = 0;
      local_35c = 0;
      local_360 = 0;
      local_364 = 0;
      local_378 = 0;
      local_380 = 0;
      local_388 = 0;
      local_390 = 0;
      local_e4 = 0x10;
      local_f4 = 0x10;
      local_104 = 0x10;
      local_20c = local_2e0;
      local_20d = 1;
      local_274 = local_2e0;
      local_275 = 1;
      local_28c = local_2e0;
      local_28d = 1;
      local_2f0 = 0;
      local_308 = 0;
      local_350 = 0;
      local_368 = 0;
      local_3e0 = 0;
      local_3d0 = 0;
      local_3c8 = 0;
      local_3b8 = 0;
      local_3b4 = 0;
      local_3b0 = 0;
      local_3ac = 0;
      local_3a8 = 0;
      local_3a0 = 0;
      local_3d8 = 0;
      local_198 = local_398;
      local_160 = local_2e8;
      local_128 = local_348;
      local_b0 = local_220;
      local_90 = local_230;
      local_70 = local_240;
      local_3c0 = local_1b0;
      local_370 = local_140;
      local_310 = local_178;
      for (local_3e4 = 0; local_3e4 + 3 < local_2dc; local_3e4 = local_3e4 + 4) {
        local_1e0 = local_2e8;
        local_3f8 = *(float (*) [2])local_2e8;
        afStack_3f0._0_8_ = *(undefined8 *)(local_2e8 + 2);
        local_1e8 = local_348;
        local_408 = *(float (*) [2])local_348;
        afStack_400 = *(float (*) [2])(local_348 + 2);
        afVar4 = BinaryOp_x86_functor::binary_op_add::func_pack4
                           (local_2c1,(__m128 *)local_3f8,(__m128 *)local_408);
        local_1d8 = afVar4._0_8_;
        auVar1._8_4_ = extraout_XMM0_Dc;
        auVar1._0_8_ = local_1d8;
        auVar1._12_4_ = extraout_XMM0_Dd;
        local_1c0 = local_398;
        uStack_410 = auVar1._8_8_;
        uStack_1d0 = uStack_410;
        *(undefined8 *)local_398 = local_1d8;
        *(undefined8 *)(local_398 + 2) = uStack_410;
        local_2e8 = local_2e8 + 4;
        local_348 = local_348 + 4;
        local_398 = local_398 + 4;
      }
      for (; local_3e4 < local_2dc; local_3e4 = local_3e4 + 1) {
        fVar3 = BinaryOp_x86_functor::binary_op_add::func(local_2c1,local_2e8,local_348);
        *local_398 = fVar3;
        local_2e8 = local_2e8 + 1;
        local_348 = local_348 + 1;
        local_398 = local_398 + 1;
      }
    }
    local_29c = 0;
  }
  return local_29c;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}